

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# union_iterator.hpp
# Opt level: O2

void __thiscall
burst::
union_iterator<__gnu_cxx::__normal_iterator<boost::iterator_range<std::_Fwd_list_const_iterator<int>_>_*,_std::vector<boost::iterator_range<std::_Fwd_list_const_iterator<int>_>,_std::allocator<boost::iterator_range<std::_Fwd_list_const_iterator<int>_>_>_>_>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/izvolov[P]burst/test/burst/range/adaptor/united.cpp:45:33)>
::maintain_invariant
          (union_iterator<__gnu_cxx::__normal_iterator<boost::iterator_range<std::_Fwd_list_const_iterator<int>_>_*,_std::vector<boost::iterator_range<std::_Fwd_list_const_iterator<int>_>,_std::allocator<boost::iterator_range<std::_Fwd_list_const_iterator<int>_>_>_>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_izvolov[P]burst_test_burst_range_adaptor_united_cpp:45:33)>
           *this)

{
  iterator_range<std::_Fwd_list_const_iterator<int>_> *piVar1;
  _Fwd_list_node_base *p_Var2;
  ulong uVar3;
  long lVar4;
  iterator_range<std::_Fwd_list_const_iterator<int>_> *piVar5;
  __normal_iterator<boost::iterator_range<std::_Fwd_list_const_iterator<int>_>_*,_std::vector<boost::iterator_range<std::_Fwd_list_const_iterator<int>_>,_std::allocator<boost::iterator_range<std::_Fwd_list_const_iterator<int>_>_>_>_>
  __last;
  iterator_range<std::_Fwd_list_const_iterator<int>_> *piVar6;
  long lVar7;
  undefined8 unaff_RBX;
  __normal_iterator<boost::iterator_range<std::_Fwd_list_const_iterator<int>_>_*,_std::vector<boost::iterator_range<std::_Fwd_list_const_iterator<int>_>,_std::allocator<boost::iterator_range<std::_Fwd_list_const_iterator<int>_>_>_>_>
  __first;
  long lVar8;
  __normal_iterator<boost::iterator_range<std::_Fwd_list_const_iterator<int>_>_*,_std::vector<boost::iterator_range<std::_Fwd_list_const_iterator<int>_>,_std::allocator<boost::iterator_range<std::_Fwd_list_const_iterator<int>_>_>_>_>
  __i;
  __normal_iterator<boost::iterator_range<std::_Fwd_list_const_iterator<int>_>_*,_std::vector<boost::iterator_range<std::_Fwd_list_const_iterator<int>_>,_std::allocator<boost::iterator_range<std::_Fwd_list_const_iterator<int>_>_>_>_>
  __last_00;
  _Iter_comp_iter<burst::compose_fn<burst::apply_fn<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_izvolov[P]burst_test_burst_range_adaptor_united_cpp:45:33)>,_burst::compose_fn<burst::by_all_fn<burst::front_t>,_burst::forward_as_tuple_fn>_>_>
  in_stack_00000008;
  
  __first._M_current = (this->m_begin)._M_current;
  piVar1 = (this->m_end)._M_current;
  lVar8 = 0x38;
  lVar7 = 0;
  for (lVar4 = (long)piVar1 - (long)__first._M_current >> 6; 0 < lVar4; lVar4 = lVar4 + -1) {
    if (*(long *)((long)__first._M_current + lVar8 + -0x38) ==
        *(long *)((long)&__first._M_current[-3].
                         super_iterator_range_base<std::_Fwd_list_const_iterator<int>,_boost::iterators::incrementable_traversal_tag>
                         .m_Begin._M_node + lVar8)) {
      __last._M_current =
           (iterator_range<std::_Fwd_list_const_iterator<int>_> *)((long)__first._M_current - lVar7)
      ;
      goto LAB_00260990;
    }
    if (*(long *)((long)__first._M_current + lVar8 + -0x28) ==
        *(long *)((long)&__first._M_current[-2].
                         super_iterator_range_base<std::_Fwd_list_const_iterator<int>,_boost::iterators::incrementable_traversal_tag>
                         .m_Begin._M_node + lVar8)) {
      __last._M_current =
           (iterator_range<std::_Fwd_list_const_iterator<int>_> *)
           ((long)__first._M_current + (0x10 - lVar7));
      goto LAB_00260990;
    }
    if (*(long *)((long)__first._M_current + lVar8 + -0x18) ==
        *(long *)((long)&__first._M_current[-1].
                         super_iterator_range_base<std::_Fwd_list_const_iterator<int>,_boost::iterators::incrementable_traversal_tag>
                         .m_Begin._M_node + lVar8)) {
      __last._M_current =
           (iterator_range<std::_Fwd_list_const_iterator<int>_> *)
           ((long)__first._M_current + (0x20 - lVar7));
      goto LAB_00260990;
    }
    if (*(long *)((long)__first._M_current + lVar8 + -8) ==
        *(long *)((long)&((__first._M_current)->
                         super_iterator_range_base<std::_Fwd_list_const_iterator<int>,_boost::iterators::incrementable_traversal_tag>
                         ).m_Begin._M_node + lVar8)) {
      __last._M_current =
           (iterator_range<std::_Fwd_list_const_iterator<int>_> *)
           ((long)__first._M_current + (0x30 - lVar7));
      goto LAB_00260990;
    }
    lVar7 = lVar7 + -0x40;
    lVar8 = lVar8 + 0x40;
  }
  lVar4 = ((long)piVar1 - (long)__first._M_current) + lVar7 >> 4;
  piVar5 = (iterator_range<std::_Fwd_list_const_iterator<int>_> *)((long)__first._M_current - lVar7)
  ;
  if (lVar4 == 1) {
LAB_00260959:
    __last._M_current = piVar5;
    if ((piVar5->
        super_iterator_range_base<std::_Fwd_list_const_iterator<int>,_boost::iterators::incrementable_traversal_tag>
        ).m_Begin._M_node !=
        (piVar5->
        super_iterator_range_base<std::_Fwd_list_const_iterator<int>,_boost::iterators::incrementable_traversal_tag>
        ).m_End._M_node) {
      __last._M_current = piVar1;
    }
  }
  else if (lVar4 == 2) {
LAB_0026094c:
    __last._M_current = piVar5;
    if ((piVar5->
        super_iterator_range_base<std::_Fwd_list_const_iterator<int>,_boost::iterators::incrementable_traversal_tag>
        ).m_Begin._M_node !=
        (piVar5->
        super_iterator_range_base<std::_Fwd_list_const_iterator<int>,_boost::iterators::incrementable_traversal_tag>
        ).m_End._M_node) {
      piVar5 = piVar5 + 1;
      goto LAB_00260959;
    }
  }
  else {
    __last._M_current = piVar1;
    if (lVar4 != 3) goto LAB_002609ce;
    __last._M_current = piVar5;
    if (*(long *)((long)__first._M_current + lVar8 + -0x38) !=
        *(long *)((long)&__first._M_current[-3].
                         super_iterator_range_base<std::_Fwd_list_const_iterator<int>,_boost::iterators::incrementable_traversal_tag>
                         .m_Begin._M_node + lVar8)) {
      piVar5 = (iterator_range<std::_Fwd_list_const_iterator<int>_> *)
               ((long)__first._M_current + (0x10 - lVar7));
      goto LAB_0026094c;
    }
  }
LAB_00260990:
  piVar5 = __last._M_current;
  if (__last._M_current != piVar1) {
    while (piVar6 = piVar5, piVar5 = piVar6 + 1, piVar5 != piVar1) {
      if ((piVar5->
          super_iterator_range_base<std::_Fwd_list_const_iterator<int>,_boost::iterators::incrementable_traversal_tag>
          ).m_Begin._M_node !=
          piVar6[1].
          super_iterator_range_base<std::_Fwd_list_const_iterator<int>,_boost::iterators::incrementable_traversal_tag>
          .m_End._M_node) {
        p_Var2 = piVar6[1].
                 super_iterator_range_base<std::_Fwd_list_const_iterator<int>,_boost::iterators::incrementable_traversal_tag>
                 .m_End._M_node;
        ((__last._M_current)->
        super_iterator_range_base<std::_Fwd_list_const_iterator<int>,_boost::iterators::incrementable_traversal_tag>
        ).m_Begin._M_node =
             (piVar5->
             super_iterator_range_base<std::_Fwd_list_const_iterator<int>,_boost::iterators::incrementable_traversal_tag>
             ).m_Begin._M_node;
        ((__last._M_current)->
        super_iterator_range_base<std::_Fwd_list_const_iterator<int>,_boost::iterators::incrementable_traversal_tag>
        ).m_End._M_node = p_Var2;
        __last._M_current = __last._M_current + 1;
      }
    }
    __first._M_current = (this->m_begin)._M_current;
  }
LAB_002609ce:
  (this->m_end)._M_current = __last._M_current;
  if (__first._M_current != __last._M_current) {
    uVar3 = (long)__last._M_current - (long)__first._M_current >> 4;
    lVar8 = 0x3f;
    if (uVar3 != 0) {
      for (; uVar3 >> lVar8 == 0; lVar8 = lVar8 + -1) {
      }
    }
    std::
    __introsort_loop<__gnu_cxx::__normal_iterator<boost::iterator_range<std::_Fwd_list_const_iterator<int>>*,std::vector<boost::iterator_range<std::_Fwd_list_const_iterator<int>>,std::allocator<boost::iterator_range<std::_Fwd_list_const_iterator<int>>>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<burst::compose_fn<burst::apply_fn<DOCTEST_ANON_SUITE_2::DOCTEST_ANON_FUNC_7()::__0>,burst::compose_fn<burst::by_all_fn<burst::front_t>,burst::forward_as_tuple_fn>>>>
              (__first,__last,(ulong)(((uint)lVar8 ^ 0x3f) * 2) ^ 0x7e,
               (_Iter_comp_iter<burst::compose_fn<burst::apply_fn<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_izvolov[P]burst_test_burst_range_adaptor_united_cpp:45:33)>,_burst::compose_fn<burst::by_all_fn<burst::front_t>,_burst::forward_as_tuple_fn>_>_>
                )SUB83(unaff_RBX,0));
    if ((long)__last._M_current - (long)__first._M_current < 0x101) {
      std::
      __insertion_sort<__gnu_cxx::__normal_iterator<boost::iterator_range<std::_Fwd_list_const_iterator<int>>*,std::vector<boost::iterator_range<std::_Fwd_list_const_iterator<int>>,std::allocator<boost::iterator_range<std::_Fwd_list_const_iterator<int>>>>>,__gnu_cxx::__ops::_Iter_comp_iter<burst::compose_fn<burst::apply_fn<DOCTEST_ANON_SUITE_2::DOCTEST_ANON_FUNC_7()::__0>,burst::compose_fn<burst::by_all_fn<burst::front_t>,burst::forward_as_tuple_fn>>>>
                (__first,__last,in_stack_00000008);
      return;
    }
    __last_00._M_current = __first._M_current + 0x10;
    std::
    __insertion_sort<__gnu_cxx::__normal_iterator<boost::iterator_range<std::_Fwd_list_const_iterator<int>>*,std::vector<boost::iterator_range<std::_Fwd_list_const_iterator<int>>,std::allocator<boost::iterator_range<std::_Fwd_list_const_iterator<int>>>>>,__gnu_cxx::__ops::_Iter_comp_iter<burst::compose_fn<burst::apply_fn<DOCTEST_ANON_SUITE_2::DOCTEST_ANON_FUNC_7()::__0>,burst::compose_fn<burst::by_all_fn<burst::front_t>,burst::forward_as_tuple_fn>>>>
              (__first,__last_00,
               (_Iter_comp_iter<burst::compose_fn<burst::apply_fn<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_izvolov[P]burst_test_burst_range_adaptor_united_cpp:45:33)>,_burst::compose_fn<burst::by_all_fn<burst::front_t>,_burst::forward_as_tuple_fn>_>_>
                )SUB83(unaff_RBX,0));
    for (; __last_00._M_current != __last._M_current;
        __last_00._M_current = __last_00._M_current + 1) {
      std::
      __unguarded_linear_insert<__gnu_cxx::__normal_iterator<boost::iterator_range<std::_Fwd_list_const_iterator<int>>*,std::vector<boost::iterator_range<std::_Fwd_list_const_iterator<int>>,std::allocator<boost::iterator_range<std::_Fwd_list_const_iterator<int>>>>>,__gnu_cxx::__ops::_Val_comp_iter<burst::compose_fn<burst::apply_fn<DOCTEST_ANON_SUITE_2::DOCTEST_ANON_FUNC_7()::__0>,burst::compose_fn<burst::by_all_fn<burst::front_t>,burst::forward_as_tuple_fn>>>>
                (__last_00,
                 (_Val_comp_iter<burst::compose_fn<burst::apply_fn<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_izvolov[P]burst_test_burst_range_adaptor_united_cpp:45:33)>,_burst::compose_fn<burst::by_all_fn<burst::front_t>,_burst::forward_as_tuple_fn>_>_>
                  )SUB83(unaff_RBX,0));
    }
  }
  return;
}

Assistant:

void remove_empty_ranges ()
        {
            m_end = std::remove_if(m_begin, m_end, [] (const auto & r) {return r.empty();});
        }